

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

void __thiscall hwnet::TCPSocket::doClose(TCPSocket *this)

{
  undefined1 auStack_48 [8];
  CloseCallback callback;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  callback.super__Function_base._M_functor._8_8_ = 0;
  callback.super__Function_base._M_manager = (_Manager_type)0x0;
  auStack_48 = (undefined1  [8])0x0;
  callback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  std::mutex::lock(&this->mtx);
  if ((this->closeCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
              ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)auStack_48,
               &this->closeCallback_);
  }
  linklist::clear(this->sendLists);
  linklist::clear(this->sendLists + 1);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  if (callback.super__Function_base._M_functor._8_8_ != 0) {
    std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPSocket,void>
              ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&callback._M_invoker,
               (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<hwnet::TCPSocket>);
    std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator()
              ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)auStack_48,
               (shared_ptr<hwnet::TCPSocket> *)&callback._M_invoker);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  }
  std::_Function_base::~_Function_base((_Function_base *)auStack_48);
  return;
}

Assistant:

void TCPSocket::doClose() {
	CloseCallback callback = nullptr;
	{
		std::lock_guard<std::mutex> guard(this->mtx);
		if(closeCallback_){
			callback = closeCallback_;
		}
		sendLists[0].clear();
		sendLists[1].clear();
	}

	if(callback) {
		callback(shared_from_this());
	}
}